

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv_pipe_chmod(uv_pipe_t *handle,int mode)

{
  int iVar1;
  uint uVar2;
  char *buffer;
  int *piVar3;
  uint uVar4;
  size_t name_len;
  size_t local_b8;
  stat64 local_b0;
  
  iVar1 = -9;
  if (((handle != (uv_pipe_t *)0x0) && ((handle->io_watcher).fd != -1)) &&
     (iVar1 = -0x16, 0xfffffffc < mode - 4U)) {
    local_b8 = 0;
    iVar1 = uv__pipe_getsockpeername(handle,getsockname,(char *)0x0,&local_b8);
    if (iVar1 == -0x69) {
      buffer = (char *)uv__malloc(local_b8);
      if (buffer == (char *)0x0) {
        iVar1 = -0xc;
      }
      else {
        iVar1 = uv__pipe_getsockpeername(handle,getsockname,buffer,&local_b8);
        if (iVar1 == 0) {
          iVar1 = stat64(buffer,&local_b0);
          if (iVar1 == -1) {
            uv__free(buffer);
          }
          else {
            uVar4 = -(mode & 1U) & 0x124;
            uVar2 = uVar4 + 0x92;
            if ((uint)mode < 2) {
              uVar2 = uVar4;
            }
            if ((uVar2 & ~local_b0.st_mode) == 0) {
              uv__free(buffer);
              return 0;
            }
            iVar1 = chmod(buffer,local_b0.st_mode | uVar2);
            uv__free(buffer);
            if (iVar1 != -1) {
              return 0;
            }
          }
          piVar3 = __errno_location();
          iVar1 = -*piVar3;
        }
        else {
          uv__free(buffer);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int uv_pipe_chmod(uv_pipe_t* handle, int mode) {
  unsigned desired_mode;
  struct stat pipe_stat;
  char* name_buffer;
  size_t name_len;
  int r;

  if (handle == NULL || uv__stream_fd(handle) == -1)
    return UV_EBADF;

  if (mode != UV_READABLE &&
      mode != UV_WRITABLE &&
      mode != (UV_WRITABLE | UV_READABLE))
    return UV_EINVAL;

  /* Unfortunately fchmod does not work on all platforms, we will use chmod. */
  name_len = 0;
  r = uv_pipe_getsockname(handle, NULL, &name_len);
  if (r != UV_ENOBUFS)
    return r;

  name_buffer = uv__malloc(name_len);
  if (name_buffer == NULL)
    return UV_ENOMEM;

  r = uv_pipe_getsockname(handle, name_buffer, &name_len);
  if (r != 0) {
    uv__free(name_buffer);
    return r;
  }

  /* stat must be used as fstat has a bug on Darwin */
  if (stat(name_buffer, &pipe_stat) == -1) {
    uv__free(name_buffer);
    return -errno;
  }

  desired_mode = 0;
  if (mode & UV_READABLE)
    desired_mode |= S_IRUSR | S_IRGRP | S_IROTH;
  if (mode & UV_WRITABLE)
    desired_mode |= S_IWUSR | S_IWGRP | S_IWOTH;

  /* Exit early if pipe already has desired mode. */
  if ((pipe_stat.st_mode & desired_mode) == desired_mode) {
    uv__free(name_buffer);
    return 0;
  }

  pipe_stat.st_mode |= desired_mode;

  r = chmod(name_buffer, pipe_stat.st_mode);
  uv__free(name_buffer);

  return r != -1 ? 0 : UV__ERR(errno);
}